

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::popConstrainedChildren
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,
          vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
          *children)

{
  __index_type *__return_storage_ptr___00;
  reference ppEVar1;
  Type *pTVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  Expression *pEVar5;
  reference pvVar6;
  size_t size;
  Expression **ppEVar7;
  size_t i_00;
  bool bVar8;
  optional<wasm::Type> oVar9;
  bool local_1ef;
  bool local_1ee;
  bool local_1ed;
  bool local_1ec;
  bool local_1eb;
  bool local_1ea;
  bool local_1e9;
  Ok local_1cd;
  uint local_1cc;
  Err local_1c8;
  Err *local_1a8;
  Err *err;
  undefined1 local_190 [8];
  Result<wasm::Expression_*> _val;
  Result<wasm::Expression_*> val;
  _Storage<unsigned_long,_true> _Stack_138;
  int i;
  _Storage<unsigned_long,_true> local_130;
  BasicType local_128 [2];
  HeapType local_120;
  bool local_111;
  HeapType HStack_110;
  bool isNone_1;
  HeapType local_108;
  int local_100;
  HeapType local_f8;
  bool local_ed;
  BasicType local_ec;
  bool isI16Array;
  HeapType HStack_e8;
  bool local_d9;
  HeapType HStack_d8;
  bool isNone;
  HeapType local_d0;
  int local_c8;
  HeapType local_c0;
  bool local_b1;
  Type TStack_b0;
  bool isI8Array;
  Type local_a8;
  _Storage<wasm::Type,_true> local_a0;
  optional<wasm::Type> bound;
  _Variadic_union<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  local_78;
  Constraint constraint;
  Type type;
  _Storage<unsigned_long,_true> _Stack_58;
  bool needUnreachableFallback;
  optional<unsigned_long> unreachableIndex;
  size_t childTupleIndex;
  size_t childIndex;
  size_t stackTupleIndex;
  size_t stackIndex;
  ScopeCtx *scope;
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  *children_local;
  ChildPopper *this_local;
  
  scope = (ScopeCtx *)children;
  children_local =
       (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
        *)this;
  this_local = (ChildPopper *)__return_storage_ptr__;
  stackIndex = (size_t)getScope(this->builder);
  stackTupleIndex =
       std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                 (&((ScopeCtx *)stackIndex)->exprStack);
  childIndex = 0;
  childTupleIndex =
       std::
       vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
       ::size((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
               *)scope);
  unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = 0;
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&stack0xffffffffffffffa8);
  type.id._7_1_ = 0;
  if ((*(byte *)(stackIndex + 0xa0) & 1) != 0) {
LAB_026307c1:
    if (unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ == 0) {
      if (childTupleIndex == 0) goto LAB_02630d1e;
      childTupleIndex = childTupleIndex - 1;
      pvVar6 = std::
               vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
               ::operator[]((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                             *)scope,childTupleIndex);
      unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = Constraint::size(&pvVar6->constraint);
    }
    unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ =
         unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._8_8_ - 1;
    while( true ) {
      if (childIndex == 0) {
        if (stackTupleIndex == 0) {
          type.id._7_1_ = 1;
          goto LAB_02630d1e;
        }
        stackTupleIndex = stackTupleIndex - 1;
        ppEVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             (stackIndex + 0x88),stackTupleIndex);
        childIndex = wasm::Type::size(&(*ppEVar1)->type);
      }
      childIndex = childIndex - 1;
      ppEVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           (stackIndex + 0x88),stackTupleIndex);
      type.id._0_4_ = 0;
      bVar8 = wasm::Type::operator==(&(*ppEVar1)->type,(BasicType *)&type);
      if (!bVar8) break;
      childIndex = 0;
    }
    ppEVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         (stackIndex + 0x88),stackTupleIndex);
    pTVar2 = wasm::Type::operator[](&(*ppEVar1)->type,childIndex);
    constraint.
    super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    .
    super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
    ._8_8_ = pTVar2->id;
    bVar8 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffffa8);
    if (bVar8) {
      pvVar6 = std::
               vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
               ::operator[]((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                             *)scope,childTupleIndex);
      local_78 = (_Variadic_union<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  )Constraint::operator[]
                             (&pvVar6->constraint,
                              (Constraint *)
                              unreachableIndex.super__Optional_base<unsigned_long,_true,_true>.
                              _M_payload.super__Optional_payload_base<unsigned_long>._8_8_,i_00);
      bVar8 = Constraint::isAnyType((Constraint *)&local_78._M_first);
      if (!bVar8) {
        bVar8 = Constraint::isAnyReference((Constraint *)&local_78._M_first);
        if (bVar8) {
          bVar8 = wasm::Type::isRef((Type *)((long)&constraint.
                                                                                                        
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                            + 8));
          local_1e9 = false;
          if (!bVar8) {
            bound.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 1;
            local_1e9 = wasm::Type::operator!=
                                  ((Type *)((long)&constraint.
                                                                                                      
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                           + 8),
                                   (BasicType *)
                                   &bound.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                                    super__Optional_payload_base<wasm::Type>.field_0xc);
          }
          if (local_1e9 != false) goto LAB_02630980;
        }
        else {
          oVar9 = Constraint::getSubtype((Constraint *)&local_78._M_first);
          local_a0 = oVar9.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Type>._M_payload;
          bound.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
               oVar9.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          bVar8 = std::optional::operator_cast_to_bool((optional *)&local_a0._M_value);
          if (bVar8) {
            local_a8.id = constraint.
                          super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          .
                          super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                          ._8_8_;
            pTVar2 = std::optional<wasm::Type>::operator*
                               ((optional<wasm::Type> *)&local_a0._M_value);
            TStack_b0.id = pTVar2->id;
            bVar8 = wasm::Type::isSubType(local_a8,TStack_b0);
            if (!bVar8) {
              type.id._7_1_ = 1;
              goto LAB_02630d1e;
            }
          }
          else {
            bVar8 = Constraint::isAnyI8ArrayReference((Constraint *)&local_78._M_first);
            if (bVar8) {
              bVar8 = wasm::Type::isRef((Type *)((long)&constraint.
                                                                                                                
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                + 8));
              local_1ea = false;
              if (bVar8) {
                local_c0 = wasm::Type::getHeapType
                                     ((Type *)((long)&constraint.
                                                                                                            
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                              + 8));
                bVar8 = HeapType::isArray(&local_c0);
                local_1ea = false;
                if (bVar8) {
                  HStack_d8 = wasm::Type::getHeapType
                                        ((Type *)((long)&constraint.
                                                                                                                  
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                 + 8));
                  HeapType::getArray(&local_d0);
                  local_1ea = local_c8 == 1;
                }
              }
              local_b1 = local_1ea;
              bVar8 = wasm::Type::isRef((Type *)((long)&constraint.
                                                                                                                
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                + 8));
              local_1eb = false;
              if (bVar8) {
                HStack_e8 = wasm::Type::getHeapType
                                      ((Type *)((long)&constraint.
                                                                                                              
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                               + 8));
                local_1eb = HeapType::isMaybeShared(&stack0xffffffffffffff18,none);
              }
              local_d9 = local_1eb;
              local_1ec = false;
              if (((local_b1 & 1U) == 0) && (local_1ec = false, local_1eb == false)) {
                local_ec = unreachable;
                local_1ec = wasm::Type::operator!=
                                      ((Type *)((long)&constraint.
                                                                                                              
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                               + 8),&local_ec);
              }
              if (local_1ec != false) {
                type.id._7_1_ = 1;
                goto LAB_02630d1e;
              }
            }
            else {
              bVar8 = Constraint::isAnyI16ArrayReference((Constraint *)&local_78._M_first);
              if (!bVar8) {
                handle_unreachable("unexpected constraint",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                                   ,0x1f6);
              }
              bVar8 = wasm::Type::isRef((Type *)((long)&constraint.
                                                                                                                
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                + 8));
              local_1ed = false;
              if (bVar8) {
                local_f8 = wasm::Type::getHeapType
                                     ((Type *)((long)&constraint.
                                                                                                            
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                              + 8));
                bVar8 = HeapType::isArray(&local_f8);
                local_1ed = false;
                if (bVar8) {
                  HStack_110 = wasm::Type::getHeapType
                                         ((Type *)((long)&constraint.
                                                                                                                    
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  + 8));
                  HeapType::getArray(&local_108);
                  local_1ed = local_100 == 2;
                }
              }
              local_ed = local_1ed;
              bVar8 = wasm::Type::isRef((Type *)((long)&constraint.
                                                                                                                
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                + 8));
              local_1ee = false;
              if (bVar8) {
                local_120 = wasm::Type::getHeapType
                                      ((Type *)((long)&constraint.
                                                                                                              
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                               + 8));
                local_1ee = HeapType::isMaybeShared(&local_120,none);
              }
              local_111 = local_1ee;
              local_1ef = false;
              if (((local_ed & 1U) == 0) && (local_1ef = false, local_1ee == false)) {
                local_128[1] = 1;
                local_1ef = wasm::Type::operator!=
                                      ((Type *)((long)&constraint.
                                                                                                              
                                                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                                  .
                                                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                               + 8),local_128 + 1);
              }
              if (local_1ef != false) {
                type.id._7_1_ = 1;
                goto LAB_02630d1e;
              }
            }
          }
        }
      }
    }
    local_128[0] = unreachable;
    bVar8 = wasm::Type::operator==
                      ((Type *)((long)&constraint.
                                       super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                       .
                                       super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                       .
                                       super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                       .
                                       super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                       .
                                       super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                                       .
                                       super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                               + 8),local_128);
    if (bVar8) {
      if (((type.id._7_1_ ^ 0xff) & 1) == 0) {
        __assert_fail("!needUnreachableFallback",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                      ,0x1fc,
                      "Result<> wasm::IRBuilder::ChildPopper::popConstrainedChildren(std::vector<Child> &)"
                     );
      }
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)&stack0xfffffffffffffec8,&stackTupleIndex);
      _Stack_58 = _Stack_138;
      unreachableIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload = local_130;
    }
    goto LAB_026307c1;
  }
LAB_02630d1e:
  sVar3 = std::
          vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
          ::size((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                  *)scope);
  val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_4_ = SUB84(sVar3,0);
LAB_02630d31:
  do {
    val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_4_ =
         val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_4_ + -1;
    if ((int)val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_4_ < 0) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1cd);
      return __return_storage_ptr__;
    }
    if ((type.id._7_1_ & 1) != 0) {
      sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         (stackIndex + 0x88));
      puVar4 = std::optional<unsigned_long>::operator*
                         ((optional<unsigned_long> *)&stack0xffffffffffffffa8);
      if ((sVar3 == *puVar4 + 1) &&
         (0 < (int)val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._36_4_)) {
        pEVar5 = (Expression *)Builder::makeUnreachable(&this->builder->builder);
        pvVar6 = std::
                 vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                 ::operator[]((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                               *)scope,(long)(int)val.val.
                                                  super__Variant_base<wasm::Expression_*,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>
                                                  ._36_4_);
        *pvVar6->childp = pEVar5;
        goto LAB_02630d31;
      }
    }
    pvVar6 = std::
             vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
             ::operator[]((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                           *)scope,(long)(int)val.val.
                                              super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                              .super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                              .super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                              .
                                              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>
                                              ._36_4_);
    size = Constraint::size(&pvVar6->constraint);
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20);
    pop((Result<wasm::Expression_*> *)__return_storage_ptr___00,this,size);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)local_190,
               (Result<wasm::Expression_*> *)__return_storage_ptr___00);
    local_1a8 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)local_190);
    bVar8 = local_1a8 != (Err *)0x0;
    if (bVar8) {
      wasm::Err::Err(&local_1c8,local_1a8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c8);
      wasm::Err::~Err(&local_1c8);
    }
    local_1cc = (uint)bVar8;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)local_190);
    if (local_1cc == 0) {
      ppEVar7 = Result<wasm::Expression_*>::operator*
                          ((Result<wasm::Expression_*> *)
                           ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      pEVar5 = *ppEVar7;
      pvVar6 = std::
               vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
               ::operator[]((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                             *)scope,(long)(int)val.val.
                                                super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                .
                                                super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>
                                                ._36_4_);
      *pvVar6->childp = pEVar5;
      local_1cc = 0;
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    if (local_1cc != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
LAB_02630980:
  type.id._7_1_ = 1;
  goto LAB_02630d1e;
}

Assistant:

Result<> popConstrainedChildren(std::vector<Child>& children) {
    auto& scope = builder.getScope();

    // Two-part indices into the stack of available expressions and the vector
    // of requirements, allowing them to move independently with the granularity
    // of a single tuple element.
    size_t stackIndex = scope.exprStack.size();
    size_t stackTupleIndex = 0;
    size_t childIndex = children.size();
    size_t childTupleIndex = 0;

    // The index of the shallowest unreachable instruction on the stack.
    std::optional<size_t> unreachableIndex;

    // Whether popping the children past the unreachable would produce a type
    // mismatch or try to pop from an empty stack.
    bool needUnreachableFallback = false;

    if (!scope.unreachable) {
      // We only need to check requirements if there is an unreachable.
      // Otherwise the validator will catch any problems.
      goto pop;
    }

    // Check whether the values on the stack will be able to meet the given
    // requirements.
    while (true) {
      // Advance to the next requirement.
      if (childTupleIndex > 0) {
        --childTupleIndex;
      } else {
        if (childIndex == 0) {
          // We have examined all the requirements.
          break;
        }
        --childIndex;
        childTupleIndex = children[childIndex].constraint.size() - 1;
      }

      // Advance to the next available value on the stack.
      while (true) {
        if (stackTupleIndex > 0) {
          --stackTupleIndex;
        } else {
          if (stackIndex == 0) {
            // No more available values. This is valid iff we are reaching past
            // an unreachable, but we still need the fallback behavior to ensure
            // the input unreachable instruction is executed first. If we are
            // not reaching past an unreachable, the error will be caught when
            // we pop.
            needUnreachableFallback = true;
            goto pop;
          }
          --stackIndex;
          stackTupleIndex = scope.exprStack[stackIndex]->type.size() - 1;
        }

        // Skip expressions that don't produce values.
        if (scope.exprStack[stackIndex]->type == Type::none) {
          stackTupleIndex = 0;
          continue;
        }
        break;
      }

      // We have an available type and a constraint. Only check constraints if
      // we are past an unreachable, since otherwise we can leave problems to be
      // caught by the validator later.
      auto type = scope.exprStack[stackIndex]->type[stackTupleIndex];
      if (unreachableIndex) {
        auto constraint = children[childIndex].constraint[childTupleIndex];
        if (constraint.isAnyType()) {
          // Always succeeds.
        } else if (constraint.isAnyReference()) {
          if (!type.isRef() && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (auto bound = constraint.getSubtype()) {
          if (!Type::isSubType(type, *bound)) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI8ArrayReference()) {
          bool isI8Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i8;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI8Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI16ArrayReference()) {
          bool isI16Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i16;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI16Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else {
          WASM_UNREACHABLE("unexpected constraint");
        }
      }

      // No problems for children after this unreachable.
      if (type == Type::unreachable) {
        assert(!needUnreachableFallback);
        unreachableIndex = stackIndex;
      }
    }

  pop:
    // We have checked all the constraints, so we are ready to pop children.
    for (int i = children.size() - 1; i >= 0; --i) {
      if (needUnreachableFallback &&
          scope.exprStack.size() == *unreachableIndex + 1 && i > 0) {
        // The next item on the stack is the unreachable instruction we must
        // not pop past. We cannot insert unreachables in front of it because
        // it might be a branch we actually have to execute, so this next item
        // must be child 0. But we are not ready to pop child 0 yet, so
        // synthesize an unreachable instead of popping. The deeper
        // instructions that would otherwise have been popped will remain on
        // the stack to become prior children of future expressions or to be
        // implicitly dropped at the end of the scope.
        *children[i].childp = builder.builder.makeUnreachable();
        continue;
      }

      // Pop a child normally.
      auto val = pop(children[i].constraint.size());
      CHECK_ERR(val);
      *children[i].childp = *val;
    }
    return Ok{};
  }